

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::EnumValueName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumValueDescriptor *enum_value)

{
  string *psVar1;
  size_type sVar2;
  EnumValueDescriptor *enum_value_local;
  string *result;
  
  psVar1 = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((anonymous_namespace)::kKeywords_abi_cxx11_,__return_storage_ptr__);
  if (sVar2 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EnumValueName(const EnumValueDescriptor* enum_value) {
  std::string result = enum_value->name();
  if (kKeywords.count(result) > 0) {
    result.append("_");
  }
  return result;
}